

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O0

void soplex::initConstVecs<double>
               (SVSetBase<double> *vecset,SVSetBase<double> *facset,SSVectorBase<double> *veclogs,
               SSVectorBase<double> *vecnnzinv,double epsilon)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SVectorBase<double> *this;
  double *pdVar4;
  int __c;
  Real __x;
  SSVectorBase<double> *this_00;
  int i_1;
  SVectorBase<double> *vecnew;
  double nnzinv;
  double a;
  int i;
  int size;
  SVectorBase<double> *lpvec;
  int nnz;
  double logsum;
  int k;
  int nvec;
  SVectorBase<double> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  SVectorBase<double> *in_stack_ffffffffffffff98;
  int i_00;
  SVectorBase<double> *pSVar5;
  double in_stack_ffffffffffffffa8;
  int n;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar6;
  undefined4 local_30;
  
  iVar2 = SVSetBase<double>::num((SVSetBase<double> *)0x1b4aa8);
  for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
    iVar6 = 0;
    this = SVSetBase<double>::operator[]
                     ((SVSetBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    iVar3 = SVectorBase<double>::size(this);
    for (n = 0; i_00 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20), n < iVar3; n = n + 1) {
      pdVar4 = SVectorBase<double>::value(this,n);
      in_stack_ffffffffffffffa8 = *pdVar4;
      bVar1 = isZero<double,double>
                        ((double)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (double)in_stack_ffffffffffffff88);
      if (!bVar1) {
        __x = spxAbs<double>(in_stack_ffffffffffffffa8);
        log2(__x);
        iVar6 = iVar6 + 1;
      }
    }
    if (iVar6 < 1) {
      this_00 = (SSVectorBase<double> *)0x3ff0000000000000;
    }
    else {
      this_00 = (SSVectorBase<double> *)(1.0 / (double)iVar6);
    }
    SSVectorBase<double>::add
              (this_00,i_00,(double)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    SSVectorBase<double>::add
              (this_00,i_00,(double)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    in_stack_ffffffffffffff98 =
         SVSetBase<double>::create
                   ((SVSetBase<double> *)CONCAT44(iVar3,n),
                    (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    for (in_stack_ffffffffffffff94 = 0; (int)in_stack_ffffffffffffff94 < iVar3;
        in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
      SVectorBase<double>::value(this,in_stack_ffffffffffffff94);
      bVar1 = isZero<double,double>
                        ((double)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (double)in_stack_ffffffffffffff88);
      pSVar5 = in_stack_ffffffffffffff98;
      if (!bVar1) {
        SVectorBase<double>::index(this,(char *)(ulong)in_stack_ffffffffffffff94,__c);
        SVectorBase<double>::add
                  ((SVectorBase<double> *)this_00,(int)((ulong)pSVar5 >> 0x20),
                   (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff98;
      }
      in_stack_ffffffffffffff98 = pSVar5;
    }
    SVectorBase<double>::sort((SVectorBase<double> *)CONCAT44(iVar6,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

static void initConstVecs(
   const SVSetBase<R>* vecset,
   SVSetBase<R>& facset,
   SSVectorBase<R>& veclogs,
   SSVectorBase<R>& vecnnzinv,
   R epsilon)
{
   assert(vecset != nullptr);

   const int nvec = vecset->num();

   for(int k = 0; k < nvec; ++k)
   {
      R logsum = 0.0;
      int nnz = 0;
      // get kth row or column of LP
      const SVectorBase<R>& lpvec = (*vecset)[k];
      const int size = lpvec.size();

      for(int i = 0; i < size; ++i)
      {
         const R a = lpvec.value(i);

         if(!isZero(a, epsilon))
         {
            logsum += log2(double(spxAbs(a))); // todo spxLog2?
            nnz++;
         }
      }

      R nnzinv;

      if(nnz > 0)
      {
         nnzinv = 1.0 / nnz;
      }
      else
      {
         /* all-0 entries */
         logsum = 1.0;
         nnzinv = 1.0;
      }

      veclogs.add(k, logsum);
      vecnnzinv.add(k, nnzinv);

      /* create new VectorBase<R> for facset */
      SVectorBase<R>& vecnew = (*(facset.create(nnz)));

      for(int i = 0; i < size; ++i)
      {
         if(!isZero(lpvec.value(i), epsilon))
            vecnew.add(lpvec.index(i), nnzinv);
      }

      vecnew.sort();
   }

   assert(veclogs.isSetup());
   assert(vecnnzinv.isSetup());
}